

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O0

pic_buf_t * ihevc_dpb_mgr_get_ref_by_poc_lsb(dpb_mgr_t *ps_dpb_mgr,WORD32 poc_lsb)

{
  dpb_info_t *ps_next_ref;
  UWORD32 i;
  pic_buf_t *ps_pic_buf;
  WORD32 poc_lsb_local;
  dpb_mgr_t *ps_dpb_mgr_local;
  
  ps_pic_buf = (pic_buf_t *)0x0;
  ps_next_ref = ps_dpb_mgr->ps_dpb_head;
  i = 0;
  do {
    if (ps_dpb_mgr->u1_num_ref_bufs <= i) {
LAB_002da286:
      if (i == ps_dpb_mgr->u1_num_ref_bufs) {
        ps_pic_buf = (pic_buf_t *)0x0;
      }
      return ps_pic_buf;
    }
    if (ps_next_ref->ps_pic_buf->i4_poc_lsb == poc_lsb) {
      ps_pic_buf = ps_next_ref->ps_pic_buf;
      goto LAB_002da286;
    }
    ps_next_ref = ps_next_ref->ps_prev_dpb;
    i = i + 1;
  } while( true );
}

Assistant:

pic_buf_t* ihevc_dpb_mgr_get_ref_by_poc_lsb(dpb_mgr_t *ps_dpb_mgr, WORD32 poc_lsb)
{
    pic_buf_t *ps_pic_buf = NULL;
    UWORD32 i;
    dpb_info_t *ps_next_ref;

    ps_next_ref = ps_dpb_mgr->ps_dpb_head;
    for(i = 0; i < ps_dpb_mgr->u1_num_ref_bufs; i++)
    {
        if(ps_next_ref->ps_pic_buf->i4_poc_lsb == poc_lsb)
        {
            ps_pic_buf = ps_next_ref->ps_pic_buf;
            break;
        }

        ps_next_ref = ps_next_ref->ps_prev_dpb;
    }

    if(i == ps_dpb_mgr->u1_num_ref_bufs)
    {
        ps_pic_buf = NULL;
    }

    return ps_pic_buf;
}